

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

ConfigBlockSymbol *
slang::ast::ConfigBlockSymbol::fromSyntax(Scope *scope,ConfigDeclarationSyntax *syntax)

{
  string_view name;
  bool bVar1;
  SourceLocation loc;
  ConfigBlockSymbol *this;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  ParameterDeclarationStatementSyntax *param;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *__range2;
  ConfigBlockSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_000005d8;
  Scope *in_stack_000005e0;
  Compilation *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff88;
  ConfigBlockSymbol *this_00;
  Token *in_stack_ffffffffffffff90;
  __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa8;
  Symbol *in_stack_ffffffffffffffb0;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_ffffffffffffffb8;
  
  loc = (SourceLocation)Scope::getCompilation(in_RDI);
  parsing::Token::valueText(in_stack_ffffffffffffff90);
  parsing::Token::location((Token *)(in_RSI + 4));
  name._M_str = (char *)in_stack_ffffffffffffff90;
  name._M_len = in_stack_ffffffffffffff88;
  this = Compilation::allocConfigBlock(in_stack_ffffffffffffff78,name,loc);
  Symbol::setSyntax(&this->super_Symbol,in_RSI);
  this_00 = this;
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_RDI,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this);
  Symbol::setAttributes
            (in_stack_ffffffffffffffb0,(Scope *)in_stack_ffffffffffffffa8._M_current,
             in_stack_ffffffffffffffb8);
  std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff78);
  std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> *)
             this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                        *)loc,(__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
    ::operator*((__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                 *)&stack0xffffffffffffffa8);
    Scope::addMembers(in_stack_000005e0,in_stack_000005d8);
    __gnu_cxx::
    __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffa8);
  }
  return this;
}

Assistant:

ConfigBlockSymbol& ConfigBlockSymbol::fromSyntax(const Scope& scope,
                                                 const ConfigDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.allocConfigBlock(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    for (auto param : syntax.localparams)
        result->addMembers(*param);

    return *result;
}